

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void wherePartIdxExpr(Parse *pParse,Index *pIdx,Expr *pPart,Bitmask *pMask,int iIdxCur,
                     SrcItem *pItem)

{
  byte bVar1;
  int iVar2;
  uint flags;
  CollSeq *p_00;
  Expr *p_01;
  Expr *pEVar3;
  Expr *in_RCX;
  ulong uVar4;
  Index *in_RDX;
  Parse *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  void *pArg;
  int bNullRow;
  IndexedExpr *p;
  sqlite3 *db;
  u8 aff;
  Expr *pRight;
  Expr *pLeft;
  Parse *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  sqlite3 *db_00;
  SrcItem *in_stack_ffffffffffffffc8;
  LogEst *pLVar5;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (*(char *)&in_RDX->zName == ',') {
    wherePartIdxExpr(in_RSI,in_RDX,in_RCX,(Bitmask *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                     (int)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8);
    in_RDX = (Index *)in_RDX->aiRowLogEst;
  }
  if ((((*(char *)&in_RDX->zName == '6') || (*(char *)&in_RDX->zName == '-')) &&
      (pLVar5 = in_RDX->aiRowLogEst, (char)*pLVar5 == -0x58)) &&
     (iVar2 = sqlite3ExprIsConstant
                        ((Parse *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (Expr *)in_stack_ffffffffffffff98), iVar2 != 0)) {
    p_00 = sqlite3ExprCompareCollSeq(in_stack_ffffffffffffff98,(Expr *)0x1f8b6e);
    iVar2 = sqlite3IsBinary(p_00);
    if (((iVar2 != 0) && (-1 < pLVar5[0x18])) &&
       (bVar1 = *(byte *)(*(long *)(*(long *)&in_RSI->rc + 8) + (long)pLVar5[0x18] * 0x10 + 9),
       0x41 < bVar1)) {
      if (in_R9 == 0) {
        if (pLVar5[0x18] < 0x3f) {
          uVar4._0_1_ = in_RCX->op;
          uVar4._1_1_ = in_RCX->affExpr;
          uVar4._2_1_ = in_RCX->op2;
          uVar4._3_1_ = in_RCX->field_0x3;
          uVar4._4_4_ = in_RCX->flags;
          uVar4 = (1L << ((byte)pLVar5[0x18] & 0x3f) ^ 0xffffffffffffffffU) & uVar4;
          in_RCX->op = (char)uVar4;
          in_RCX->affExpr = (char)(uVar4 >> 8);
          in_RCX->op2 = (char)(uVar4 >> 0x10);
          in_RCX->field_0x3 = (char)(uVar4 >> 0x18);
          in_RCX->flags = (int)(uVar4 >> 0x20);
        }
      }
      else {
        db_00 = (sqlite3 *)*in_RDI;
        p_01 = (Expr *)sqlite3DbMallocRaw((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,
                                          CONCAT44(in_stack_ffffffffffffffa4,
                                                   in_stack_ffffffffffffffa0));
        if (p_01 != (Expr *)0x0) {
          flags = (uint)((*(byte *)(in_R9 + 0x18) & 0x48) != 0);
          pEVar3 = sqlite3ExprDup(db_00,p_01,flags);
          *(Expr **)p_01 = pEVar3;
          (p_01->u).iValue = *(int *)(in_R9 + 0x1c);
          *(undefined4 *)((long)&p_01->u + 4) = in_R8D;
          *(int *)&p_01->pLeft = (int)pLVar5[0x18];
          *(char *)((long)&p_01->pLeft + 4) = (char)flags;
          p_01->pRight = (Expr *)in_RDI[0xd];
          *(byte *)((long)&p_01->pLeft + 5) = bVar1;
          in_RDI[0xd] = p_01;
          if (p_01->pRight == (Expr *)0x0) {
            sqlite3ParserAddCleanup
                      ((Parse *)db_00,(_func_void_sqlite3_ptr_void_ptr *)p_01,
                       (void *)CONCAT44(flags,in_stack_ffffffffffffffa0));
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void wherePartIdxExpr(
  Parse *pParse,                  /* Parse context */
  Index *pIdx,                    /* Partial index being processed */
  Expr *pPart,                    /* WHERE clause being processed */
  Bitmask *pMask,                 /* Mask to clear bits in */
  int iIdxCur,                    /* Cursor number for index */
  SrcItem *pItem                  /* The FROM clause entry for the table */
){
  assert( pItem==0 || (pItem->fg.jointype & JT_RIGHT)==0 );
  assert( (pItem==0 || pMask==0) && (pMask!=0 || pItem!=0) );

  if( pPart->op==TK_AND ){
    wherePartIdxExpr(pParse, pIdx, pPart->pRight, pMask, iIdxCur, pItem);
    pPart = pPart->pLeft;
  }

  if( (pPart->op==TK_EQ || pPart->op==TK_IS) ){
    Expr *pLeft = pPart->pLeft;
    Expr *pRight = pPart->pRight;
    u8 aff;

    if( pLeft->op!=TK_COLUMN ) return;
    if( !sqlite3ExprIsConstant(0, pRight) ) return;
    if( !sqlite3IsBinary(sqlite3ExprCompareCollSeq(pParse, pPart)) ) return;
    if( pLeft->iColumn<0 ) return;
    aff = pIdx->pTable->aCol[pLeft->iColumn].affinity;
    if( aff>=SQLITE_AFF_TEXT ){
      if( pItem ){
        sqlite3 *db = pParse->db;
        IndexedExpr *p = (IndexedExpr*)sqlite3DbMallocRaw(db, sizeof(*p));
        if( p ){
          int bNullRow = (pItem->fg.jointype&(JT_LEFT|JT_LTORJ))!=0;
          p->pExpr = sqlite3ExprDup(db, pRight, 0);
          p->iDataCur = pItem->iCursor;
          p->iIdxCur = iIdxCur;
          p->iIdxCol = pLeft->iColumn;
          p->bMaybeNullRow = bNullRow;
          p->pIENext = pParse->pIdxPartExpr;
          p->aff = aff;
          pParse->pIdxPartExpr = p;
          if( p->pIENext==0 ){
            void *pArg = (void*)&pParse->pIdxPartExpr;
            sqlite3ParserAddCleanup(pParse, whereIndexedExprCleanup, pArg);
          }
        }
      }else if( pLeft->iColumn<(BMS-1) ){
        *pMask &= ~((Bitmask)1 << pLeft->iColumn);
      }
    }
  }
}